

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::
check_and_initialize_maps
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,
          Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this
          ,vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
           *maps)

{
  pointer pdVar1;
  size_type sVar2;
  const_reference ppPVar3;
  size_type sVar4;
  undefined8 *puVar5;
  reference pvVar6;
  pointer pdVar7;
  allocator<double> local_69;
  value_type_conflict1 local_68;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> v;
  size_t i_1;
  allocator<std::vector<double,_std::allocator<double>_>_> local_2a;
  undefined1 local_29;
  size_type local_28;
  size_t i;
  vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
  *maps_local;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *this_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *heat_maps;
  
  local_28 = 0;
  i = (size_t)maps;
  maps_local = (vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                *)this;
  this_local = (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
                *)__return_storage_ptr__;
  while( true ) {
    sVar4 = local_28;
    sVar2 = std::
            vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
            ::size((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                    *)i);
    if (sVar4 == sVar2) {
      local_29 = 0;
      ppPVar3 = std::
                vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                ::operator[]((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                              *)i,0);
      sVar4 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(&(*ppPVar3)->heat_map);
      std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_2a);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(__return_storage_ptr__,sVar4,&local_2a);
      std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_2a);
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      while( true ) {
        pdVar1 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        ppPVar3 = std::
                  vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                  ::operator[]((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                                *)i,0);
        pdVar7 = (pointer)std::
                          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ::size(&(*ppPVar3)->heat_map);
        if (pdVar1 == pdVar7) break;
        ppPVar3 = std::
                  vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                  ::operator[]((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                                *)i,0);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](&(*ppPVar3)->heat_map,0);
        sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
        local_68 = 0.0;
        std::allocator<double>::allocator(&local_69);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_60,sVar4,&local_68,&local_69);
        std::allocator<double>::~allocator(&local_69);
        pvVar6 = std::
                 vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ::operator[](__return_storage_ptr__,
                              (size_type)
                              v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
        std::vector<double,_std::allocator<double>_>::operator=
                  (pvVar6,(vector<double,_std::allocator<double>_> *)local_60);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_60);
        v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)((long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 1);
      }
      return __return_storage_ptr__;
    }
    ppPVar3 = std::
              vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
              ::operator[]((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                            *)i,local_28);
    sVar4 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&(*ppPVar3)->heat_map);
    ppPVar3 = std::
              vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
              ::operator[]((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                            *)i,0);
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(&(*ppPVar3)->heat_map);
    if (sVar4 != sVar2) break;
    ppPVar3 = std::
              vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
              ::operator[]((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                            *)i,local_28);
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&(*ppPVar3)->heat_map,0);
    sVar4 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
    ppPVar3 = std::
              vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
              ::operator[]((vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                            *)i,0);
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](&(*ppPVar3)->heat_map,0);
    sVar2 = std::vector<double,_std::allocator<double>_>::size(pvVar6);
    if (sVar4 != sVar2) {
      std::operator<<((ostream *)&std::cerr,
                      "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n"
                     );
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = 
      "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
      __cxa_throw(puVar5,&char_const*::typeinfo,0);
    }
    local_28 = local_28 + 1;
  }
  std::operator<<((ostream *)&std::cerr,
                  "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n"
                 );
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

std::vector<std::vector<double> > Persistence_heat_maps<Scalling_of_kernels>::check_and_initialize_maps(
    const std::vector<Persistence_heat_maps*>& maps) {
  // checking if all the heat maps are of the same size:
  for (size_t i = 0; i != maps.size(); ++i) {
    if (maps[i]->heat_map.size() != maps[0]->heat_map.size()) {
      std::cerr << "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
      throw "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
    }
    if (maps[i]->heat_map[0].size() != maps[0]->heat_map[0].size()) {
      std::cerr << "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
      throw "Sizes of Persistence_heat_maps are not compatible. The program will terminate now \n";
    }
  }
  std::vector<std::vector<double> > heat_maps(maps[0]->heat_map.size());
  for (size_t i = 0; i != maps[0]->heat_map.size(); ++i) {
    std::vector<double> v(maps[0]->heat_map[0].size(), 0);
    heat_maps[i] = v;
  }
  return heat_maps;
}